

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall wabt::LocalTypes::Set(LocalTypes *this,TypeVector *types)

{
  bool bVar1;
  Enum EVar2;
  Enum EVar3;
  const_reference pvVar4;
  size_type sVar5;
  uint local_24;
  uint local_20;
  Index i;
  Index count;
  Type type;
  TypeVector *types_local;
  LocalTypes *this_local;
  
  _count = types;
  std::
  vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
  ::clear(&this->decls_);
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty(_count);
  if (!bVar1) {
    pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](_count,0);
    i = pvVar4->enum_;
    local_20 = 1;
    for (local_24 = 1; sVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(_count),
        local_24 < sVar5; local_24 = local_24 + 1) {
      pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (_count,(ulong)local_24);
      EVar2 = Type::operator_cast_to_Enum(pvVar4);
      EVar3 = Type::operator_cast_to_Enum((Type *)&i);
      if (EVar2 == EVar3) {
        local_20 = local_20 + 1;
      }
      else {
        std::
        vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
        ::emplace_back<wabt::Type&,unsigned_int&>
                  ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                    *)this,(Type *)&i,&local_20);
        pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                           (_count,(ulong)local_24);
        i = pvVar4->enum_;
        local_20 = 1;
      }
    }
    std::
    vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>::
    emplace_back<wabt::Type&,unsigned_int&>
              ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                *)this,(Type *)&i,&local_20);
  }
  return;
}

Assistant:

void LocalTypes::Set(const TypeVector& types) {
  decls_.clear();
  if (types.empty()) {
    return;
  }

  Type type = types[0];
  Index count = 1;
  for (Index i = 1; i < types.size(); ++i) {
    if (types[i] != type) {
      decls_.emplace_back(type, count);
      type = types[i];
      count = 1;
    } else {
      ++count;
    }
  }
  decls_.emplace_back(type, count);
}